

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.cc
# Opt level: O0

int ECDH_compute_key(void *out,size_t outlen,EC_POINT *pub_key,EC_KEY *ecdh,KDF *KDF)

{
  long lVar1;
  int iVar2;
  EC_GROUP *group_00;
  void *pvVar3;
  EC_POINT *local_170;
  size_t buf_len;
  uint8_t buf [66];
  EC_JACOBIAN shared_point;
  EC_GROUP *group;
  EC_SCALAR *priv;
  _func_void_ptr_void_ptr_size_t_void_ptr_size_t_ptr *kdf_local;
  EC_KEY *priv_key_local;
  EC_POINT *pub_key_local;
  size_t out_len_local;
  void *out_local;
  
  pub_key_local = (EC_POINT *)outlen;
  out_len_local = (size_t)out;
  if (*(long *)(ecdh + 0x10) == 0) {
    ERR_put_error(0x1b,0,0x65,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh.cc"
                  ,0x22);
    out_local._4_4_ = -1;
  }
  else {
    lVar1 = *(long *)(ecdh + 0x10);
    group_00 = (EC_GROUP *)EC_KEY_get0_group(ecdh);
    iVar2 = EC_GROUP_cmp((EC_GROUP *)group_00,*(EC_GROUP **)pub_key,(BN_CTX *)0x0);
    if (iVar2 == 0) {
      iVar2 = ec_point_mul_scalar(group_00,(EC_JACOBIAN *)(buf + 0x40),(EC_JACOBIAN *)(pub_key + 8),
                                  (EC_SCALAR *)(lVar1 + 0x18));
      if ((iVar2 == 0) ||
         (iVar2 = ec_get_x_coordinate_as_bytes
                            (group_00,(uint8_t *)&buf_len,(size_t *)&local_170,0x42,
                             (EC_JACOBIAN *)(buf + 0x40)), iVar2 == 0)) {
        ERR_put_error(0x1b,0,0x66,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh.cc"
                      ,0x32);
        out_local._4_4_ = -1;
      }
      else {
        if (KDF == (KDF *)0x0) {
          if (local_170 < pub_key_local) {
            pub_key_local = local_170;
          }
          OPENSSL_memcpy((void *)out_len_local,&buf_len,(size_t)pub_key_local);
        }
        else {
          pvVar3 = (*KDF)(&buf_len,(size_t)local_170,(void *)out_len_local,(size_t *)&pub_key_local)
          ;
          if (pvVar3 == (void *)0x0) {
            ERR_put_error(0x1b,0,100,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh.cc"
                          ,0x38);
            return -1;
          }
        }
        if (pub_key_local < (EC_POINT *)0x80000000) {
          out_local._4_4_ = (int)pub_key_local;
        }
        else {
          ERR_put_error(0x1b,0,0x45,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh.cc"
                        ,0x44);
          out_local._4_4_ = -1;
        }
      }
    }
    else {
      ERR_put_error(0xf,0,0x6a,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh.cc"
                    ,0x28);
      out_local._4_4_ = -1;
    }
  }
  return out_local._4_4_;
}

Assistant:

int ECDH_compute_key(void *out, size_t out_len, const EC_POINT *pub_key,
                     const EC_KEY *priv_key,
                     void *(*kdf)(const void *in, size_t inlen, void *out,
                                  size_t *out_len)) {
  if (priv_key->priv_key == NULL) {
    OPENSSL_PUT_ERROR(ECDH, ECDH_R_NO_PRIVATE_VALUE);
    return -1;
  }
  const EC_SCALAR *const priv = &priv_key->priv_key->scalar;
  const EC_GROUP *const group = EC_KEY_get0_group(priv_key);
  if (EC_GROUP_cmp(group, pub_key->group, NULL) != 0) {
    OPENSSL_PUT_ERROR(EC, EC_R_INCOMPATIBLE_OBJECTS);
    return -1;
  }

  EC_JACOBIAN shared_point;
  uint8_t buf[EC_MAX_BYTES];
  size_t buf_len;
  if (!ec_point_mul_scalar(group, &shared_point, &pub_key->raw, priv) ||
      !ec_get_x_coordinate_as_bytes(group, buf, &buf_len, sizeof(buf),
                                    &shared_point)) {
    OPENSSL_PUT_ERROR(ECDH, ECDH_R_POINT_ARITHMETIC_FAILURE);
    return -1;
  }

  if (kdf != NULL) {
    if (kdf(buf, buf_len, out, &out_len) == NULL) {
      OPENSSL_PUT_ERROR(ECDH, ECDH_R_KDF_FAILED);
      return -1;
    }
  } else {
    // no KDF, just copy as much as we can
    if (buf_len < out_len) {
      out_len = buf_len;
    }
    OPENSSL_memcpy(out, buf, out_len);
  }

  if (out_len > INT_MAX) {
    OPENSSL_PUT_ERROR(ECDH, ERR_R_OVERFLOW);
    return -1;
  }

  return (int)out_len;
}